

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.h
# Opt level: O3

void run_container_remove_range(run_container_t *run,uint32_t min,uint32_t max)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  rle16_t *prVar5;
  int iVar6;
  ushort uVar7;
  ushort uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  
  uVar7 = (ushort)min;
  prVar5 = run->runs;
  iVar6 = run->n_runs;
  uVar8 = (ushort)max;
  if (iVar6 < 1) {
    uVar4 = 0xffffffff;
    uVar10 = 0xffffffff;
  }
  else {
    iVar3 = iVar6 + -1;
    uVar10 = 0;
    iVar11 = iVar3;
    do {
      uVar9 = iVar11 + uVar10 >> 1;
      uVar12 = (ulong)uVar9;
      if ((ushort)(prVar5[uVar12].length + prVar5[uVar12].value) < uVar7) {
        uVar10 = uVar9 + 1;
      }
      else {
        if (prVar5[uVar12].value <= uVar7) goto LAB_00103bc2;
        iVar11 = uVar9 - 1;
      }
    } while ((int)uVar10 <= iVar11);
    uVar12 = (ulong)~uVar10;
LAB_00103bc2:
    uVar10 = (uint)uVar12;
    uVar9 = 0;
    do {
      uVar2 = iVar3 + uVar9 >> 1;
      uVar4 = (ulong)uVar2;
      if ((ushort)(prVar5[uVar4].length + prVar5[uVar4].value) < uVar8) {
        uVar9 = uVar2 + 1;
      }
      else {
        if (prVar5[uVar4].value <= uVar8) goto LAB_00103bf6;
        iVar3 = uVar2 - 1;
      }
    } while ((int)uVar9 <= iVar3);
    uVar4 = (ulong)~uVar9;
LAB_00103bf6:
    if (-1 < (int)uVar10) {
      uVar1 = prVar5[uVar12].value;
      if (uVar1 < min) {
        if (max < (uint)prVar5[uVar12].length + (uint)uVar1) {
          uVar10 = uVar10 + 1;
          if (run->capacity <= iVar6) {
            run_container_grow(run,iVar6 + 1,true);
            iVar6 = run->n_runs;
            prVar5 = run->runs;
          }
          uVar9 = uVar10 & 0xffff;
          memmove(prVar5 + (ulong)uVar9 + 1,prVar5 + uVar9,(long)(int)(iVar6 - uVar9) << 2);
          run->n_runs = run->n_runs + 1;
          prVar5 = run->runs;
          prVar5[uVar10].value = uVar8 + 1;
          uVar1 = prVar5[uVar12].value;
          prVar5[uVar10].length = ~uVar8 + uVar1 + prVar5[uVar12].length;
          prVar5[uVar12].length = ~uVar1 + uVar7;
          return;
        }
        prVar5[uVar12].length = ~uVar1 + uVar7;
        uVar10 = uVar10 + 1;
      }
      goto LAB_00103ca3;
    }
  }
  uVar10 = ~uVar10;
LAB_00103ca3:
  uVar9 = (uint)uVar4;
  if ((int)uVar9 < 0) {
    uVar9 = -uVar9 - 2;
  }
  else {
    uVar7 = prVar5[uVar4].length + prVar5[uVar4].value;
    if (max < uVar7) {
      prVar5[uVar4].value = uVar8 + 1;
      prVar5[uVar4].length = uVar7 - (uVar8 + 1);
      uVar9 = uVar9 - 1;
    }
  }
  if ((int)uVar10 <= (int)uVar9) {
    uVar9 = ~uVar9;
    iVar3 = iVar6 + uVar9;
    iVar11 = uVar10 + uVar9;
    if ((iVar11 != 0 && SCARRY4(uVar10,uVar9) == iVar11 < 0) && (run->capacity < iVar11 + iVar3)) {
      run_container_grow(run,iVar11 + iVar3,true);
      iVar6 = run->n_runs;
      prVar5 = run->runs;
    }
    memmove(prVar5 + ((iVar6 - iVar3) + iVar11),prVar5 + (iVar6 - iVar3),(long)iVar3 << 2);
    run->n_runs = run->n_runs + iVar11;
  }
  return;
}

Assistant:

static inline void run_container_remove_range(run_container_t *run,
                                              uint32_t min, uint32_t max) {
    int32_t first = rle16_find_run(run->runs, run->n_runs, (uint16_t)min);
    int32_t last = rle16_find_run(run->runs, run->n_runs, (uint16_t)max);

    if (first >= 0 && min > run->runs[first].value &&
        max < ((uint32_t)run->runs[first].value +
               (uint32_t)run->runs[first].length)) {
        // split this run into two adjacent runs

        // right subinterval
        makeRoomAtIndex(run, (uint16_t)(first + 1));
        run->runs[first + 1].value = (uint16_t)(max + 1);
        run->runs[first + 1].length =
            (uint16_t)((run->runs[first].value + run->runs[first].length) -
                       (max + 1));

        // left subinterval
        run->runs[first].length =
            (uint16_t)((min - 1) - run->runs[first].value);

        return;
    }

    // update left-most partial run
    if (first >= 0) {
        if (min > run->runs[first].value) {
            run->runs[first].length =
                (uint16_t)((min - 1) - run->runs[first].value);
            first++;
        }
    } else {
        first = -first - 1;
    }

    // update right-most run
    if (last >= 0) {
        uint16_t run_max = run->runs[last].value + run->runs[last].length;
        if (run_max > max) {
            run->runs[last].value = (uint16_t)(max + 1);
            run->runs[last].length = (uint16_t)(run_max - (max + 1));
            last--;
        }
    } else {
        last = (-last - 1) - 1;
    }

    // remove intermediate runs
    if (first <= last) {
        run_container_shift_tail(run, run->n_runs - (last + 1),
                                 -(last - first + 1));
    }
}